

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O1

void __thiscall
Refal2::CModuleBuilder::SetExternal
          (CModuleBuilder *this,CToken *nameToken,CToken *externalNameToken)

{
  bool bVar1;
  TLabel function;
  CPreparatoryFunction *function_00;
  long *plVar2;
  size_type *psVar3;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = checkModuleExist(this,nameToken);
  if (bVar1) {
    function = declare(this,nameToken);
    function_00 = getFunction(this,function);
    bVar1 = checkOnlyDeclared(this,function_00,nameToken);
    if (bVar1) {
      if (function_00->entry == false) {
        CPreparatoryFunction::SetDefined(function_00,nameToken);
        CPreparatoryFunction::SetExternal(function_00,externalNameToken);
        return;
      }
      std::operator+(&local_40,"function `",&nameToken->word);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_60.field_2._M_allocated_capacity = *psVar3;
        local_60.field_2._8_8_ = plVar2[3];
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      }
      else {
        local_60.field_2._M_allocated_capacity = *psVar3;
        local_60._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_60._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      CErrorsHelper::RaiseError((CErrorsHelper *)this,ES_Error,&local_60,nameToken);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void CModuleBuilder::SetExternal( const CToken& nameToken,
	const CToken& externalNameToken )
{
	if( !checkModuleExist( nameToken ) ) {
		return;
	}
	CPreparatoryFunction& function = addFunction( nameToken );
	if( checkOnlyDeclared( function, nameToken ) ) {
		if( !function.IsEntry() ) {
			function.SetDefined( nameToken );
			function.SetExternal( externalNameToken );
		} else {
			error( nameToken, "function `" + nameToken.word +
				"` already defined as entry" );
		}
	}
}